

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,char_const*&>(pybind11 *this,char **args_)

{
  handle hVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  array<pybind11::object,_1UL> args;
  handle local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_88 = detail::type_caster<char,_void>::cast(*args_,automatic_reference,(handle)0x0);
  if (local_88.m_ptr == (PyObject *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    type_id<std::tuple<char_const*&>>();
    std::operator+(&local_40,"make_tuple(): unable to convert arguments of types \'",&local_80);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_60 = (long *)*plVar2;
    plVar3 = plVar2 + 2;
    if (local_60 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
    }
    local_58 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_60);
    *(undefined ***)this_00 = &PTR__runtime_error_0011da48;
    __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tuple::tuple((tuple *)this,1);
  hVar1.m_ptr = local_88.m_ptr;
  local_88.m_ptr = (PyObject *)0x0;
  if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) != 0) {
    *(PyObject **)(*(long *)this + 0x18) = hVar1.m_ptr;
    object::~object((object *)&local_88);
    return (object)(object)this;
  }
  __assert_fail("PyTuple_Check(result.ptr())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                ,0x496,
                "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const char *&>]"
               );
}

Assistant:

tuple make_tuple(Args&&... args_) {
    const size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (auto &arg_value : args) {
        if (!arg_value) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            throw cast_error("make_tuple(): unable to convert arguments of types '" +
                (std::string) type_id<std::tuple<Args...>>() + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}